

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str-util.cc
# Opt level: O2

string * tinyusdz::unescapeControlSequence(string *__return_storage_ptr__,string *str)

{
  ulong uVar1;
  char cVar2;
  pointer pcVar3;
  ulong uVar4;
  ulong uVar5;
  char cVar6;
  string s;
  
  s._M_dataplus._M_p = (pointer)&s.field_2;
  s._M_string_length = 0;
  s.field_2._M_local_buf[0] = '\0';
  uVar4 = str->_M_string_length;
  if (uVar4 < 2) {
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)str);
  }
  else {
    for (uVar5 = 0; uVar5 < uVar4; uVar5 = uVar5 + 1) {
      pcVar3 = (str->_M_dataplus)._M_p;
      cVar6 = (char)&s;
      if (pcVar3[uVar5] != '\\') {
        ::std::__cxx11::string::push_back(cVar6);
        goto switchD_0020e5f2_caseD_6f;
      }
      uVar1 = uVar5 + 1;
      if (uVar4 <= uVar1) goto switchD_0020e5f2_caseD_6f;
      cVar2 = pcVar3[uVar1];
      switch(cVar2) {
      case 'n':
        break;
      case 'o':
      case 'p':
      case 'q':
      case 's':
      case 'u':
        goto switchD_0020e5f2_caseD_6f;
      case 'r':
        break;
      case 't':
        break;
      case 'v':
        break;
      default:
        if (cVar2 == '\\') {
          ::std::__cxx11::string::append((char *)&s);
        }
        else if (((cVar2 == 'f') || (cVar2 == 'b')) || (cVar2 == 'a')) break;
        goto switchD_0020e5f2_caseD_6f;
      }
      ::std::__cxx11::string::push_back(cVar6);
      uVar5 = uVar1;
switchD_0020e5f2_caseD_6f:
      uVar4 = str->_M_string_length;
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)s._M_dataplus._M_p == &s.field_2) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(s.field_2._M_allocated_capacity._1_7_,s.field_2._M_local_buf[0]);
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = s.field_2._8_8_;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = s._M_dataplus._M_p;
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(s.field_2._M_allocated_capacity._1_7_,s.field_2._M_local_buf[0]);
    }
    __return_storage_ptr__->_M_string_length = s._M_string_length;
    s._M_string_length = 0;
    s.field_2._M_local_buf[0] = '\0';
    s._M_dataplus._M_p = (pointer)&s.field_2;
  }
  ::std::__cxx11::string::_M_dispose();
  return __return_storage_ptr__;
}

Assistant:

std::string unescapeControlSequence(const std::string &str) {
  std::string s;

  if (str.size() < 2) {
    return str;
  }

  for (size_t i = 0; i < str.size(); i++) {
    if (str[i] == '\\') {
      if (i + 1 < str.size()) {
        if (str[i + 1] == 'a') {
          s += '\a';
          i++;
        } else if (str[i + 1] == 'b') {
          s += '\b';
          i++;
        } else if (str[i + 1] == 't') {
          s += '\t';
          i++;
        } else if (str[i + 1] == 'v') {
          s += '\v';
          i++;
        } else if (str[i + 1] == 'f') {
          s += '\f';
          i++;
        } else if (str[i + 1] == 'n') {
          s += '\n';
          i++;
        } else if (str[i + 1] == 'r') {
          s += '\r';
          i++;
        } else if (str[i + 1] == '\\') {
          s += "\\";
        } else {
          // ignore backslash
        }
      } else {
        // ignore backslash
      }
    } else {
      s += str[i];
    }
  }

  return s;
}